

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double bradford_pdf(double x,double a,double b,double c)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((a < x) && (x <= b)) {
    dVar1 = log(c + 1.0);
    dVar1 = c / (dVar1 * (((x - a) * c + b) - a));
  }
  return dVar1;
}

Assistant:

double bradford_pdf ( double x, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_PDF evaluates the Bradford PDF.
//
//  Discussion:
//
//    PDF(A,B,C;X) = C / ( ( C * ( X - A ) + B - A ) * log ( C + 1 ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    A <= X
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, double BRADFORD_PDF, the value of the PDF.
//
{
  double pdf = 0.0;

  if ( x <= a )
  {
    pdf = 0.0;
  }
  else if ( x <= b )
  {
    pdf = c / ( ( c * ( x - a ) + b - a ) * log ( c + 1.0 ) );
  }
  else if ( b < x )
  {
    pdf = 0.0;
  }

  return pdf;
}